

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.h
# Opt level: O0

void __thiscall
icu_63::UnifiedCache::get<icu_63::SharedNumberFormat>
          (UnifiedCache *this,CacheKey<icu_63::SharedNumberFormat> *key,void *creationContext,
          SharedNumberFormat **ptr,UErrorCode *status)

{
  UBool UVar1;
  SharedNumberFormat *local_48;
  SharedNumberFormat *tvalue;
  SharedObject *value;
  UErrorCode *pUStack_30;
  UErrorCode creationStatus;
  UErrorCode *status_local;
  SharedNumberFormat **ptr_local;
  void *creationContext_local;
  CacheKey<icu_63::SharedNumberFormat> *key_local;
  UnifiedCache *this_local;
  
  pUStack_30 = status;
  status_local = (UErrorCode *)ptr;
  ptr_local = (SharedNumberFormat **)creationContext;
  creationContext_local = key;
  key_local = (CacheKey<icu_63::SharedNumberFormat> *)this;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    value._4_4_ = U_ZERO_ERROR;
    tvalue = (SharedNumberFormat *)0x0;
    _get(this,(CacheKeyBase *)creationContext_local,(SharedObject **)&tvalue,ptr_local,
         (UErrorCode *)((long)&value + 4));
    local_48 = tvalue;
    UVar1 = ::U_SUCCESS(value._4_4_);
    if (UVar1 != '\0') {
      SharedObject::copyPtr<icu_63::SharedNumberFormat>
                (local_48,(SharedNumberFormat **)status_local);
    }
    SharedObject::clearPtr<icu_63::SharedNumberFormat>(&local_48);
    if ((*pUStack_30 == U_ZERO_ERROR) || (UVar1 = ::U_FAILURE(value._4_4_), UVar1 != '\0')) {
      *pUStack_30 = value._4_4_;
    }
  }
  return;
}

Assistant:

void get(
           const CacheKey<T>& key,
           const void *creationContext,
           const T *&ptr,
           UErrorCode &status) const {
       if (U_FAILURE(status)) {
           return;
       }
       UErrorCode creationStatus = U_ZERO_ERROR;
       const SharedObject *value = NULL;
       _get(key, value, creationContext, creationStatus);
       const T *tvalue = (const T *) value;
       if (U_SUCCESS(creationStatus)) {
           SharedObject::copyPtr(tvalue, ptr);
       }
       SharedObject::clearPtr(tvalue);
       // Take care not to overwrite a warning status passed in with
       // another warning or U_ZERO_ERROR.
       if (status == U_ZERO_ERROR || U_FAILURE(creationStatus)) {
           status = creationStatus;
       }
   }